

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

vertex_iterator __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::ObtainVertexFromVertexMap
          (Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
           *this,shared_ptr<xmotion::StateExample> *state)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *id;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  _Var3;
  Vertex *this_00;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  shared_ptr<xmotion::StateExample> local_50;
  shared_ptr<xmotion::StateExample> local_40;
  _Hash_node_base *local_30;
  Vertex *local_28;
  
  local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  id = (_Hash_node_base *)
       DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>::
       operator()<xmotion::StateExample,_true>
                 ((DefaultIndexer<std::shared_ptr<xmotion::StateExample>_> *)this,&local_40);
  if (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
  uVar4 = (ulong)id % uVar1;
  p_Var5 = (this->vertex_map_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, id != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) || (p_Var6 = p_Var5, id == p_Var2[1]._M_nxt))
      goto LAB_001048fb;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001048fb:
  if (p_Var6 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if ((_Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
       )_Var3._M_cur ==
      (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
       )0x0) {
    this_00 = (Vertex *)operator_new(0x78);
    local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
    if (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Vertex::Vertex(this_00,&local_50,(int64_t)id);
    if (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    (this_00->search_parent).super_const_vertex_iterator.super_VertexMapTypeIterator.
    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
    ._M_cur = (__node_type *)0x0;
    local_30 = id;
    local_28 = this_00;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->vertex_map_);
    uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
    uVar4 = (ulong)id % uVar1;
    p_Var5 = (this->vertex_map_)._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, id != p_Var5->_M_nxt[1]._M_nxt)) {
      while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) || (p_Var6 = p_Var5, id == p_Var2[1]._M_nxt))
        goto LAB_001049e2;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_001049e2:
    if (p_Var6 == (__node_base_ptr)0x0) {
      _Var3._M_cur = (__node_type *)0x0;
    }
    else {
      _Var3._M_cur = (__node_type *)p_Var6->_M_nxt;
    }
  }
  return (vertex_iterator)_Var3._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}